

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<fmt::v5::internal::custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
               (custom_formatter<wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                     *arg)

{
  handle h;
  custom_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_RSI;
  custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
  *in_RDI;
  unkbyte10 in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff92;
  handle local_38;
  basic_string_view<wchar_t> local_28 [2];
  bool local_1;
  
  switch(*(undefined4 *)&in_RSI[1].value) {
  case 0:
  default:
switchD_0016d3a8_default:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI);
    break;
  case 1:
    goto switchD_0016d3a8_default;
  case 2:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,*(int *)&in_RSI->value);
    break;
  case 3:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,*(uint *)&in_RSI->value);
    break;
  case 4:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,(longlong)in_RSI->value);
    break;
  case 5:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,(unsigned_long_long)in_RSI->value);
    break;
  case 6:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,*(int *)&in_RSI->value != 0);
    break;
  case 7:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,*(wchar_t *)&in_RSI->value);
    break;
  case 8:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,(double)in_RSI->value);
    break;
  case 9:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,*(longdouble *)in_RSI);
    break;
  case 10:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,(wchar_t *)in_RSI->value);
    break;
  case 0xb:
    basic_string_view<wchar_t>::basic_string_view
              (local_28,(wchar_t *)in_RSI->value,(size_t)in_RSI->format);
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,local_28[0]);
    break;
  case 0xc:
    local_1 = internal::
              custom_formatter<wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
              ::operator()(in_RDI,in_RSI->value);
    break;
  case 0xd:
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::handle::handle(&local_38,*in_RSI);
    h.custom_.format._2_6_ = in_stack_ffffffffffffff92;
    h.custom_._0_10_ = in_stack_ffffffffffffff88;
    local_1 = internal::
              custom_formatter<wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              ::operator()((custom_formatter<wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                            *)0x16d567,h);
  }
  return local_1;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}